

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpki.c
# Opt level: O1

err_t bpkiPrivkeyUnwrap(octet *privkey,size_t *privkey_len,octet *epki,size_t epki_len,octet *pwd,
                       size_t pwd_len)

{
  octet *buf;
  octet *pki;
  bool_t bVar1;
  err_t eVar2;
  size_t sVar3;
  octet *salt;
  size_t count;
  size_t edata_len;
  size_t iter;
  size_t local_50;
  octet *local_48;
  octet *local_40;
  size_t local_38;
  
  eVar2 = 0x6d;
  if ((((epki_len != 0xffffffffffffffff) &&
       (local_48 = privkey, bVar1 = memIsValid(epki,epki_len), bVar1 != 0)) &&
      (bVar1 = memIsValid(pwd,pwd_len), bVar1 != 0)) &&
     ((privkey_len == (size_t *)0x0 || (bVar1 = memIsValid(privkey_len,8), bVar1 != 0)))) {
    sVar3 = bpkiEdataDec((octet *)0x0,&local_50,(octet *)0x0,(size_t *)0x0,epki,epki_len);
    eVar2 = 0x132;
    if (sVar3 == epki_len) {
      salt = (octet *)blobCreate(local_50 + 0x28);
      if (salt == (octet *)0x0) {
        eVar2 = 0x6e;
      }
      else {
        local_40 = salt + 0x28;
        bpkiEdataDec(local_40,(size_t *)0x0,salt,&local_38,epki,epki_len);
        eVar2 = beltPBKDF2(salt + 8,pwd,pwd_len,local_38,salt,8);
        pki = local_40;
        if ((eVar2 == 0) &&
           (eVar2 = beltKWPUnwrap(local_40,local_40,local_50,(octet *)0x0,salt + 8,0x20),
           buf = local_48, eVar2 == 0)) {
          count = local_50 - 0x10;
          sVar3 = bpkiPrivkeyDec(local_48,&local_50,pki,count);
          eVar2 = 0x132;
          if (sVar3 == count) {
            if (buf == (octet *)0x0) {
              eVar2 = 0;
            }
            else {
              bVar1 = memIsValid(buf,local_50);
              eVar2 = 0x6d;
              if (bVar1 != 0) {
                eVar2 = 0;
              }
            }
            if (eVar2 == 0) {
              bpkiPrivkeyDec(local_48,privkey_len,pki,count);
              eVar2 = 0;
            }
          }
        }
        blobClose(salt);
      }
    }
  }
  return eVar2;
}

Assistant:

err_t bpkiPrivkeyUnwrap(octet privkey[], size_t* privkey_len,
	const octet epki[], size_t epki_len, const octet pwd[], size_t pwd_len)
{
	size_t edata_len, pki_len, count, iter;
	void* state;
	octet* salt;
	octet* key;
	octet* edata;
	err_t code;
	// проверить входные данные
	if (epki_len == SIZE_MAX || !memIsValid(epki, epki_len) ||
		!memIsValid(pwd, pwd_len) ||
		privkey_len && !memIsValid(privkey_len, O_PER_S))
		return ERR_BAD_INPUT;
	// определить размер edata
	count = bpkiEdataDec(0, &edata_len, 0, 0, epki, epki_len);
	if (count != epki_len)
		return ERR_BAD_FORMAT;
	// подготовить буферы для параметров PBKDF2
	state = blobCreate(8 + 32 + edata_len);
	if (!state)
		return ERR_OUTOFMEMORY;
	salt = (octet*)state;
	key = salt + 8;
	edata = key + 32;
	// выделить edata
	count = bpkiEdataDec(edata, 0, salt, &iter, epki, epki_len);
	ASSERT(count == epki_len);
	// построить ключ защиты 
	code = beltPBKDF2(key, pwd, pwd_len, iter, salt, 8);
	ERR_CALL_HANDLE(code, blobClose(state));
	// снять защиту
	code = beltKWPUnwrap(edata, edata, edata_len, 0, key, 32);
	ERR_CALL_HANDLE(code, blobClose(state));
	pki_len = edata_len - 16;
	// определить длину privkey
	count = bpkiPrivkeyDec(privkey, &edata_len, edata, pki_len);
	code = count == pki_len ? ERR_OK : ERR_BAD_FORMAT;
	ERR_CALL_HANDLE(code, blobClose(state));
	// проверить указатель share 
	code = memIsNullOrValid(privkey, edata_len) ? ERR_OK : ERR_BAD_INPUT;
	ERR_CALL_HANDLE(code, blobClose(state));
	// декодировать pki
	count = bpkiPrivkeyDec(privkey, privkey_len, edata, pki_len);
	ASSERT(count == pki_len);
	// завершить
	blobClose(state);
	return code;
}